

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int incomplete(lua_State *L,int status)

{
  int iVar1;
  char *pcVar2;
  char *msg;
  size_t lmsg;
  lua_State *plStack_18;
  int status_local;
  lua_State *L_local;
  
  if (((status == 3) &&
      (lmsg._4_4_ = status, plStack_18 = L, pcVar2 = lua_tolstring(L,-1,(size_t *)&msg),
      (char *)0x4 < msg)) && (iVar1 = strcmp(pcVar2 + (long)msg + -5,"<eof>"), iVar1 == 0)) {
    lua_settop(plStack_18,-2);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int incomplete (lua_State *L, int status) {
  if (status == LUA_ERRSYNTAX) {
    size_t lmsg;
    const char *msg = lua_tolstring(L, -1, &lmsg);
    if (lmsg >= marklen && strcmp(msg + lmsg - marklen, EOFMARK) == 0) {
      lua_pop(L, 1);
      return 1;
    }
  }
  return 0;  /* else... */
}